

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_fnmatch.c
# Opt level: O1

int loop(uchar *pattern,uchar *string)

{
  ushort *puVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  undefined1 auVar6 [4];
  short sVar7;
  bool bVar8;
  byte bVar9;
  ushort uVar11;
  int iVar12;
  uint uVar13;
  ushort **ppuVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  byte *pbVar18;
  byte bVar19;
  bool bVar20;
  uchar charset [271];
  char local_16d;
  undefined1 local_168 [4];
  short sStack_164;
  undefined2 local_160;
  byte *local_158;
  undefined4 local_150;
  undefined4 local_14c;
  char local_148 [256];
  char local_48;
  char local_47;
  char local_46;
  char local_45;
  char local_44;
  char local_43;
  char local_42;
  char local_41;
  char local_40;
  char local_3f;
  char local_3e;
  char cVar10;
  
  memset(local_148,0,0x10f);
LAB_004b14c9:
  bVar20 = true;
  while (bVar20) {
    bVar19 = *pattern;
    if (bVar19 != 0x5c) {
      if (bVar19 < 0x3f) {
        if (bVar19 == 0) {
          bVar20 = *string == 0;
          goto LAB_004b1ca1;
        }
        pbVar18 = pattern;
        if (bVar19 == 0x2a) goto LAB_004b14f9;
      }
      else {
        if (bVar19 == 0x3f) {
          ppuVar14 = __ctype_b_loc();
          if ((*(byte *)((long)*ppuVar14 + (ulong)*string * 2 + 1) & 0x40) == 0) {
            return 2 - (uint)(*string == 0);
          }
          goto LAB_004b1ad1;
        }
        if (bVar19 == 0x5b) {
          pbVar18 = pattern + 1;
          lVar15 = 0;
          local_16d = local_48;
          local_150 = 0;
          bVar20 = false;
          uVar17 = 0;
          local_158 = string;
          goto LAB_004b156c;
        }
      }
      if (bVar19 != *string) {
        return 1;
      }
      goto LAB_004b1ad1;
    }
    pattern = pattern + 1;
    bVar20 = false;
  }
  ppuVar14 = __ctype_b_loc();
  if ((*(byte *)((long)*ppuVar14 + (ulong)*pattern * 2 + 1) & 0x40) == 0) {
    return 2;
  }
  if (*pattern != *string) {
    return 1;
  }
LAB_004b1ad1:
  pattern = pattern + 1;
  goto LAB_004b1ad4;
LAB_004b156c:
  do {
  } while (4 < (uint)lVar15);
  bVar19 = *pbVar18;
  uVar16 = (ulong)bVar19;
  uVar13 = (&switchD_004b1582::switchdataD_00513ff4)[lVar15];
  switch(lVar15) {
  case 0:
    ppuVar14 = __ctype_b_loc();
    puVar1 = *ppuVar14;
    if ((puVar1[uVar16] & 8) == 0) {
      bVar5 = true;
      if (bVar19 < 0x3f) {
        if (bVar19 == 0x21) {
switchD_004b15bb_caseD_5e:
          if (bVar20) goto LAB_004b17f8;
          if (local_16d == '\0') {
            local_48 = '\x01';
            local_16d = '\x01';
          }
          else {
            local_148[uVar16] = '\x01';
            bVar20 = true;
          }
          goto LAB_004b18ea;
        }
        if ((bVar19 == 0x2a) || (bVar19 != 0)) goto switchD_004b15bb_default;
        goto LAB_004b1aea;
      }
      switch(bVar19) {
      case 0x5b:
        goto switchD_004b15bb_caseD_5b;
      case 0x5c:
        uVar17 = (ulong)pbVar18[1];
        if ((*(byte *)((long)puVar1 + uVar17 * 2 + 1) & 0x40) == 0) goto LAB_004b1adc;
        local_148[uVar17] = '\x01';
        pbVar18 = pbVar18 + 2;
        bVar20 = true;
        lVar15 = 1;
        goto LAB_004b156c;
      case 0x5d:
        if (bVar20) goto LAB_004b1ae8;
        local_148[uVar16] = '\x01';
        pbVar18 = pbVar18 + 1;
        bVar20 = true;
        lVar15 = 3;
        goto LAB_004b156c;
      case 0x5e:
        goto switchD_004b15bb_caseD_5e;
      default:
switchD_004b15bb_default:
        local_148[uVar16] = '\x01';
        pbVar18 = pbVar18 + 1;
        bVar20 = true;
        lVar15 = 0;
        goto LAB_004b156c;
      }
    }
    local_148[uVar16] = '\x01';
    pbVar18 = pbVar18 + 1;
    bVar20 = true;
    lVar15 = 1;
    uVar17 = uVar16;
    goto LAB_004b156c;
  case 1:
    lVar15 = 0;
    if (bVar19 == 0x5b) goto LAB_004b156c;
    if (bVar19 == 0x2d) {
      local_148[uVar16] = '\x01';
      pbVar18 = pbVar18 + 1;
      local_150 = (undefined4)
                  CONCAT71((int7)((ulong)((long)&switchD_004b1582::switchdataD_00513ff4 +
                                         (long)(int)uVar13) >> 8),0x2d);
      lVar15 = 2;
      goto LAB_004b156c;
    }
    ppuVar14 = __ctype_b_loc();
    if (((*ppuVar14)[uVar16] & 8) != 0) {
      local_148[uVar16] = '\x01';
      pbVar18 = pbVar18 + 1;
      lVar15 = 1;
      goto LAB_004b156c;
    }
    bVar5 = true;
    if (bVar19 == 0x5c) {
      if ((*(byte *)((long)*ppuVar14 + (ulong)pbVar18[1] * 2 + 1) & 0x40) == 0) {
        pbVar18 = pbVar18 + 1;
        goto LAB_004b1aea;
      }
      local_148[pbVar18[1]] = '\x01';
      pbVar18 = pbVar18 + 2;
      lVar15 = 1;
      goto LAB_004b156c;
    }
    if (bVar19 != 0x5d) goto LAB_004b1aea;
    break;
  case 2:
    if (bVar19 == 0x5c) {
      uVar16 = (ulong)pbVar18[1];
      pbVar18 = pbVar18 + 1;
      ppuVar14 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar14 + uVar16 * 2 + 1) & 0x40) == 0) goto LAB_004b1adf;
    }
    if ((char)uVar16 == '\\') {
      uVar16 = (ulong)pbVar18[1];
      ppuVar14 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar14 + uVar16 * 2 + 1) & 0x40) == 0) {
LAB_004b1adc:
        pbVar18 = pbVar18 + 1;
        goto LAB_004b1adf;
      }
      local_148[uVar16] = '\x01';
      pbVar18 = pbVar18 + 2;
      lVar15 = 0;
    }
    else {
      lVar15 = 2;
      if ((int)uVar16 == 0x5d) break;
    }
    bVar19 = (byte)uVar16;
    if ((byte)uVar17 <= bVar19) {
      ppuVar14 = __ctype_b_loc();
      puVar1 = *ppuVar14;
      uVar11 = puVar1[uVar16];
      if (((((uVar11 >> 9 & 1) != 0) && ((*(byte *)((long)puVar1 + uVar17 * 2 + 1) & 2) != 0)) ||
          (((uVar11 >> 0xb & 1) != 0 && ((*(byte *)((long)puVar1 + uVar17 * 2 + 1) & 8) != 0)))) ||
         ((bVar5 = true, (uVar11 >> 8 & 1) != 0 &&
          ((*(byte *)((long)puVar1 + uVar17 * 2 + 1) & 1) != 0)))) {
        local_148[(byte)local_150] = '\0';
        uVar13 = (int)uVar17 + 1;
        if (bVar19 < (byte)uVar13) {
          uVar17 = (ulong)(byte)((byte)uVar17 + 2);
        }
        else {
          do {
            cVar10 = (char)uVar13;
            bVar9 = cVar10 + 1;
            uVar13 = (uint)bVar9;
            local_148[(ulong)bVar9 - 1] = '\x01';
          } while (bVar9 <= bVar19);
          uVar17 = (ulong)(byte)(cVar10 + 2);
        }
        goto LAB_004b18ea;
      }
      goto LAB_004b1aea;
    }
    goto LAB_004b156c;
  case 3:
    if (bVar19 == 0x5b) {
      local_148[uVar16] = '\x01';
      pbVar18 = pbVar18 + 1;
      lVar15 = 4;
    }
    else {
      if (bVar19 == 0) {
LAB_004b1adf:
        bVar5 = true;
        goto LAB_004b1aea;
      }
      if (bVar19 == 0x5d) break;
      ppuVar14 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar14 + uVar16 * 2 + 1) & 0x40) == 0) goto LAB_004b1adf;
LAB_004b17f8:
      local_148[uVar16] = '\x01';
LAB_004b18ea:
      pbVar18 = pbVar18 + 1;
      lVar15 = 0;
    }
    goto LAB_004b156c;
  case 4:
    lVar15 = 0;
    if (bVar19 != 0x5d) {
      local_148[uVar16] = '\x01';
      pbVar18 = pbVar18 + 1;
      goto LAB_004b156c;
    }
  }
LAB_004b1ae8:
  bVar5 = false;
  goto LAB_004b1aea;
switchD_004b15bb_caseD_5b:
  if (pbVar18[1] == 0x3a) {
    pbVar18 = pbVar18 + 2;
    local_160 = 0;
    _local_168 = 0;
    uVar16 = 0;
    bVar4 = false;
    bVar2 = false;
    do {
      if (uVar16 < 10) {
        bVar19 = pbVar18[uVar16];
        if (bVar2) {
          bVar2 = true;
          if (bVar19 != 0x5d) goto LAB_004b1609;
          bVar4 = true;
          bVar8 = true;
        }
        else if ((~puVar1[bVar19] & 0x600) == 0) {
          local_168[uVar16] = bVar19;
          bVar8 = false;
        }
        else {
          bVar2 = false;
          bVar3 = false;
          bVar8 = true;
          if (bVar19 != 0x3a) goto LAB_004b1644;
        }
        bVar2 = bVar8;
        bVar3 = true;
      }
      else {
LAB_004b1609:
        bVar3 = false;
      }
LAB_004b1644:
      if (!bVar3) goto LAB_004b1768;
      uVar16 = uVar16 + 1;
    } while (!bVar4);
    auVar6 = local_168;
    sVar7 = sStack_164;
    pbVar18 = pbVar18 + uVar16;
    if (sStack_164 == 0x74 && local_168 == (undefined1  [4])0x69676964) {
      local_46 = '\x01';
      goto LAB_004b19f9;
    }
    if (sStack_164 == 0x6d && local_168 == (undefined1  [4])0x756e6c61) {
      local_47 = '\x01';
      goto LAB_004b19f9;
    }
    if (sStack_164 == 0x61 && local_168 == (undefined1  [4])0x68706c61) {
      local_44 = '\x01';
      goto LAB_004b19f9;
    }
    if (stack0xfffffffffffffe9b == 0x746967 && auVar6 == (undefined1  [4])0x67696478) {
      local_45 = '\x01';
      goto LAB_004b19f9;
    }
    if (sVar7 == 0x74 && auVar6 == (undefined1  [4])0x6e697270) {
      local_43 = '\x01';
      goto LAB_004b19f9;
    }
    if (sVar7 == 0x68 && auVar6 == (undefined1  [4])0x70617267) {
      local_40 = '\x01';
      goto LAB_004b19f9;
    }
    if (sVar7 == 0x65 && auVar6 == (undefined1  [4])0x63617073) {
      local_3f = '\x01';
      goto LAB_004b19f9;
    }
    if (sVar7 == 0x6b && auVar6 == (undefined1  [4])0x6e616c62) {
      local_42 = '\x01';
      goto LAB_004b19f9;
    }
    if (sVar7 == 0x72 && auVar6 == (undefined1  [4])0x65707075) {
      local_3e = '\x01';
      goto LAB_004b19f9;
    }
    if (sVar7 == 0x72 && auVar6 == (undefined1  [4])0x65776f6c) {
      local_41 = '\x01';
      goto LAB_004b19f9;
    }
LAB_004b1768:
    bVar2 = false;
  }
  else {
    pbVar18 = pbVar18 + 1;
    local_148[uVar16] = '\x01';
LAB_004b19f9:
    bVar20 = true;
    bVar2 = true;
  }
  lVar15 = 0;
  if (!bVar2) goto LAB_004b1aea;
  goto LAB_004b156c;
LAB_004b1aea:
  string = local_158;
  if (bVar5) {
    bVar20 = false;
    local_14c = 2;
  }
  else {
    uVar17 = (ulong)*local_158;
    uVar11 = 1;
    if (local_148[uVar17] == '\0') {
      if (local_47 == '\0') {
        if (local_44 == '\0') {
          if (local_46 == '\0') {
            if (local_45 == '\0') {
              if (local_43 == '\0') {
                if (local_3f == '\0') {
                  if (local_3e == '\0') {
                    if (local_41 == '\0') {
                      if (local_42 == '\0') {
                        if (local_40 == '\0') {
                          uVar11 = 0;
                        }
                        else {
                          ppuVar14 = __ctype_b_loc();
                          uVar11 = (*ppuVar14)[uVar17] & 0x8000;
                          string = local_158;
                        }
                      }
                      else {
                        uVar11 = (ushort)(uVar17 == 9 || uVar17 == 0x20);
                      }
                    }
                    else {
                      ppuVar14 = __ctype_b_loc();
                      uVar11 = (*ppuVar14)[uVar17] & 0x200;
                    }
                  }
                  else {
                    ppuVar14 = __ctype_b_loc();
                    uVar11 = (*ppuVar14)[uVar17] & 0x100;
                  }
                }
                else {
                  ppuVar14 = __ctype_b_loc();
                  uVar11 = (*ppuVar14)[uVar17] & 0x2000;
                }
              }
              else {
                ppuVar14 = __ctype_b_loc();
                uVar11 = (*ppuVar14)[uVar17] & 0x4000;
              }
            }
            else {
              ppuVar14 = __ctype_b_loc();
              uVar11 = (*ppuVar14)[uVar17] & 0x1000;
            }
          }
          else {
            ppuVar14 = __ctype_b_loc();
            uVar11 = (*ppuVar14)[uVar17] & 0x800;
          }
        }
        else {
          ppuVar14 = __ctype_b_loc();
          uVar11 = (*ppuVar14)[uVar17] & 0x400;
        }
      }
      else {
        ppuVar14 = __ctype_b_loc();
        uVar11 = (*ppuVar14)[uVar17] & 8;
      }
    }
    if ((uVar11 == 0) == (local_48 == '\0')) {
      bVar20 = (uVar11 == 0) != (local_48 == '\0');
      local_14c = 1;
    }
    else {
      pattern = pbVar18 + 1;
      string = string + 1;
      memset(local_148,0,0x10f);
      bVar20 = true;
    }
  }
  if (!bVar20) {
    return local_14c;
  }
  goto LAB_004b14c9;
LAB_004b14f9:
  do {
    pattern = pbVar18;
    pbVar18 = pattern + 1;
  } while (pattern[1] == 0x2a);
  bVar19 = *string;
  if (pattern[1] == 0 && bVar19 == 0) {
    return 0;
  }
  iVar12 = loop(pattern + 1,string);
  if ((bVar19 == 0) || (iVar12 == 0)) {
    bVar20 = iVar12 == 0;
LAB_004b1ca1:
    return (uint)!bVar20;
  }
LAB_004b1ad4:
  string = string + 1;
  goto LAB_004b14c9;
}

Assistant:

static int loop(const unsigned char *pattern, const unsigned char *string)
{
  loop_state state = CURLFNM_LOOP_DEFAULT;
  unsigned char *p = (unsigned char *)pattern;
  unsigned char *s = (unsigned char *)string;
  unsigned char charset[CURLFNM_CHSET_SIZE] = { 0 };
  int rc = 0;

  for(;;) {
    switch(state) {
    case CURLFNM_LOOP_DEFAULT:
      if(*p == '*') {
        while(*(p+1) == '*') /* eliminate multiple stars */
          p++;
        if(*s == '\0' && *(p+1) == '\0')
          return CURL_FNMATCH_MATCH;
        rc = loop(p + 1, s); /* *.txt matches .txt <=> .txt matches .txt */
        if(rc == CURL_FNMATCH_MATCH)
          return CURL_FNMATCH_MATCH;
        if(*s) /* let the star eat up one character */
          s++;
        else
          return CURL_FNMATCH_NOMATCH;
      }
      else if(*p == '?') {
        if(ISPRINT(*s)) {
          s++;
          p++;
        }
        else if(*s == '\0')
          return CURL_FNMATCH_NOMATCH;
        else
          return CURL_FNMATCH_FAIL; /* cannot deal with other character */
      }
      else if(*p == '\0') {
        if(*s == '\0')
          return CURL_FNMATCH_MATCH;
        else
          return CURL_FNMATCH_NOMATCH;
      }
      else if(*p == '\\') {
        state = CURLFNM_LOOP_BACKSLASH;
        p++;
      }
      else if(*p == '[') {
        unsigned char *pp = p+1; /* cannot handle with pointer to register */
        if(setcharset(&pp, charset)) {
          int found = FALSE;
          if(charset[(unsigned int)*s])
            found = TRUE;
          else if(charset[CURLFNM_ALNUM])
            found = ISALNUM(*s);
          else if(charset[CURLFNM_ALPHA])
            found = ISALPHA(*s);
          else if(charset[CURLFNM_DIGIT])
            found = ISDIGIT(*s);
          else if(charset[CURLFNM_XDIGIT])
            found = ISXDIGIT(*s);
          else if(charset[CURLFNM_PRINT])
            found = ISPRINT(*s);
          else if(charset[CURLFNM_SPACE])
            found = ISSPACE(*s);
          else if(charset[CURLFNM_UPPER])
            found = ISUPPER(*s);
          else if(charset[CURLFNM_LOWER])
            found = ISLOWER(*s);
          else if(charset[CURLFNM_BLANK])
            found = ISBLANK(*s);
          else if(charset[CURLFNM_GRAPH])
            found = ISGRAPH(*s);

          if(charset[CURLFNM_NEGATE])
            found = !found;

          if(found) {
            p = pp+1;
            s++;
            memset(charset, 0, CURLFNM_CHSET_SIZE);
          }
          else
            return CURL_FNMATCH_NOMATCH;
        }
        else
          return CURL_FNMATCH_FAIL;
      }
      else {
        if(*p++ != *s++)
          return CURL_FNMATCH_NOMATCH;
      }
      break;
    case CURLFNM_LOOP_BACKSLASH:
      if(ISPRINT(*p)) {
        if(*p++ == *s++)
          state = CURLFNM_LOOP_DEFAULT;
        else
          return CURL_FNMATCH_NOMATCH;
      }
      else
        return CURL_FNMATCH_FAIL;
      break;
    }
  }
}